

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O0

void __thiscall CKey::MakeNewKey(CKey *this,bool fCompressedIn)

{
  long lVar1;
  Span<unsigned_char> bytes;
  byte bVar2;
  bool bVar3;
  byte in_SIL;
  CKey *in_RDI;
  long in_FS_OFFSET;
  array<unsigned_char,_32UL> *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_SIL & 1;
  MakeKeyData(in_RDI);
  do {
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::operator*((unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                 *)CONCAT17(bVar2,in_stack_ffffffffffffffd8));
    Span<unsigned_char>::Span<std::array<unsigned_char,32ul>>
              ((Span<unsigned_char> *)CONCAT17(bVar2,in_stack_ffffffffffffffd8),
               (array<unsigned_char,_32UL> *)in_RDI,in_stack_ffffffffffffffc8);
    bytes.m_size._0_7_ = in_stack_ffffffffffffffd8;
    bytes.m_data = &in_RDI->fCompressed;
    bytes.m_size._7_1_ = bVar2;
    GetStrongRandBytes(bytes);
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::operator->((unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                  *)in_stack_ffffffffffffffc8);
    std::array<unsigned_char,_32UL>::data(in_stack_ffffffffffffffc8);
    bVar3 = Check(in_stack_ffffffffffffffc8->_M_elems);
  } while (((bVar3 ^ 0xffU) & 1) != 0);
  in_RDI->fCompressed = (bool)(bVar2 & 1);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CKey::MakeNewKey(bool fCompressedIn) {
    MakeKeyData();
    do {
        GetStrongRandBytes(*keydata);
    } while (!Check(keydata->data()));
    fCompressed = fCompressedIn;
}